

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O0

void worker_scheduler_init_function(__cilkrts_worker *w)

{
  cilk_worker_type cVar1;
  __cilkrts_worker *in_RDI;
  
  if (in_RDI->g->under_ptool == 0) {
    __cilkrts_metacall(0,5,in_RDI);
  }
  mysrand(in_RDI,in_RDI->self + 1);
  cVar1 = in_RDI->l->type;
  if (cVar1 == WORKER_SYSTEM) {
    signal_node_wait((signal_node_t *)0x116124);
    notify_children_run((__cilkrts_worker *)0x11612e);
    in_RDI->l->steal_failure_count = 0;
  }
  else if (cVar1 != WORKER_USER) {
    __cilkrts_bug("Unknown worker %p of type %d entering scheduling loop\n",in_RDI,
                  (ulong)in_RDI->l->type);
  }
  return;
}

Assistant:

static void worker_scheduler_init_function(__cilkrts_worker *w)
{
    // First, execute the startup tasks that must happen for all
    // worker types.
    ITT_SYNC_PREPARE(w);
    /* Notify tools about the new worker. Inspector needs this, but we
       don't want to confuse Cilkscreen with system threads.  User threads
       do this notification in bind_thread */
    if (! w->g->under_ptool)
        __cilkrts_cilkscreen_establish_worker(w);

    // Seed the initial random number generator.
    // If we forget to do this, then the worker always steals from 0.
    // Programs will still execute correctly, but
    // you may see a subtle performance bug...
    mysrand(w, (w->self + 1));

    // The startup work varies, depending on the worker type.
    switch (w->l->type) {
    case WORKER_USER:
        break;

    case WORKER_SYSTEM:
        // If a system worker is starting, we must also be starting
        // the runtime.

        // Runtime begins in a wait-state and is woken up by the first user
        // worker when the runtime is ready.
        signal_node_wait(w->l->signal_node);
        // ...
        // Runtime is waking up.
        notify_children_run(w);
        w->l->steal_failure_count = 0;
        break;
    default:
        __cilkrts_bug("Unknown worker %p of type %d entering scheduling loop\n",
                      w, w->l->type);
    }
}